

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::addRowsInterface
          (Highs *this,HighsInt ext_num_new_row,double *ext_row_lower,double *ext_row_upper,
          HighsInt ext_num_new_nz,HighsInt *ext_ar_start,HighsInt *ext_ar_index,double *ext_ar_value
          )

{
  HighsInt *pHVar1;
  int iVar2;
  HighsInt bound_scale;
  pointer pdVar3;
  bool bVar4;
  HighsStatus HVar5;
  HighsStatus from_return_status;
  ulong uVar6;
  ulong uVar7;
  size_type __new_size;
  double dVar8;
  allocator_type local_2da;
  allocator local_2d9;
  HighsLp *local_2d8;
  HighsLogOptions *local_2d0;
  string local_2c8;
  ulong local_2a8;
  HighsInt *local_2a0;
  vector<double,_std::allocator<double>_> local_rowUpper;
  vector<double,_std::allocator<double>_> local_rowLower;
  HighsSparseMatrix local_ar_matrix;
  HighsIndexCollection local_1f0;
  string local_1a0;
  string local_180;
  HighsLogOptions local_160;
  HighsLogOptions local_100;
  HighsSparseMatrix local_a0;
  
  if ((ext_num_new_nz | ext_num_new_row) < 0) {
    return kError;
  }
  if (ext_num_new_row == 0) {
    return kOk;
  }
  local_2d0 = &(this->options_).super_HighsOptionsStruct.log_options;
  local_2a0 = ext_ar_start;
  bVar4 = isRowDataNull(local_2d0,ext_row_lower,ext_row_upper);
  if (bVar4) {
    return kError;
  }
  if (ext_num_new_nz != 0) {
    bVar4 = isMatrixDataNull(local_2d0,local_2a0,ext_ar_index,ext_ar_value);
    if (bVar4) {
      return kError;
    }
    if ((this->model_).lp_.num_col_ < 1) {
      return kError;
    }
  }
  local_2d8 = &(this->model_).lp_;
  iVar2 = (this->model_).lp_.num_row_;
  local_1f0.is_set_ = false;
  local_1f0.set_num_entries_ = -1;
  local_1f0.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1f0.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1f0.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1f0.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1f0.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  local_1f0.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = 0;
  local_1f0.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_1f0._41_8_ = 0;
  local_1f0.is_interval_ = true;
  local_1f0.from_ = 0;
  local_1f0.to_ = ext_num_new_row + -1;
  uVar6 = (ulong)(uint)ext_num_new_row;
  local_1f0.dimension_ = ext_num_new_row;
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_rowLower,ext_row_lower,
             ext_row_lower + uVar6,(allocator_type *)&local_ar_matrix);
  local_2a8 = uVar6;
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_rowUpper,ext_row_upper,
             ext_row_upper + uVar6,(allocator_type *)&local_ar_matrix);
  HighsLogOptions::HighsLogOptions(&local_100,local_2d0);
  HVar5 = assessBounds(&this->options_,"Row",(this->model_).lp_.num_row_,&local_1f0,&local_rowLower,
                       &local_rowUpper,(this->options_).super_HighsOptionsStruct.infinite_bound,
                       (HighsVarType *)0x0);
  std::__cxx11::string::string((string *)&local_ar_matrix,"assessBounds",(allocator *)&local_2c8);
  from_return_status = interpretCallStatus(&local_100,HVar5,kOk,(string *)&local_ar_matrix);
  std::__cxx11::string::~string((string *)&local_ar_matrix);
  std::_Function_base::~_Function_base(&local_100.user_callback.super__Function_base);
  HVar5 = kError;
  if (from_return_status == kError) goto LAB_00250807;
  bound_scale = (this->model_).lp_.user_bound_scale_;
  if (bound_scale != 0) {
    bVar4 = boundScaleOk(&local_rowLower,&local_rowUpper,bound_scale,
                         (this->options_).super_HighsOptionsStruct.infinite_bound);
    if (!bVar4) {
      highsLogUser(local_2d0,kError,"User bound scaling yields infinite bound\n");
      goto LAB_00250807;
    }
    dVar8 = ldexp(1.0,(this->model_).lp_.user_bound_scale_);
    uVar6 = 0;
    uVar7 = 0;
    if (0 < ext_num_new_row) {
      uVar7 = (ulong)(uint)ext_num_new_row;
    }
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      local_rowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6] =
           local_rowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar6] * dVar8;
      local_rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6] =
           local_rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar6] * dVar8;
    }
  }
  appendRowsToLpVectors(local_2d8,ext_num_new_row,&local_rowLower,&local_rowUpper);
  HighsSparseMatrix::HighsSparseMatrix(&local_ar_matrix);
  local_ar_matrix.num_col_ = ((HighsLp *)&local_2d8->num_col_)->num_col_;
  local_ar_matrix.format_ = kRowwise;
  local_ar_matrix.num_row_ = ext_num_new_row;
  if (ext_num_new_nz == 0) {
    local_2c8._M_dataplus._M_p._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (&local_ar_matrix.start_,(ulong)(ext_num_new_row + 1),
               (value_type_conflict2 *)&local_2c8);
LAB_002506a6:
    HighsSparseMatrix::HighsSparseMatrix(&local_a0,&local_ar_matrix);
    HighsSparseMatrix::addRows(&(this->model_).lp_.a_matrix_,&local_a0,(int8_t *)0x0);
    HighsSparseMatrix::~HighsSparseMatrix(&local_a0);
    if ((this->model_).lp_.scale_.has_scaling == true) {
      __new_size = (long)iVar2 + (long)ext_num_new_row;
      std::vector<double,_std::allocator<double>_>::resize
                (&(this->model_).lp_.scale_.row,__new_size);
      iVar2 = (this->model_).lp_.num_row_;
      uVar6 = 0;
      uVar7 = 0;
      if (0 < ext_num_new_row) {
        uVar7 = (ulong)(uint)ext_num_new_row;
      }
      pdVar3 = (this->model_).lp_.scale_.row.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
        pdVar3[(long)iVar2 + uVar6] = 1.0;
      }
      (this->model_).lp_.scale_.num_row = (HighsInt)__new_size;
      HighsSparseMatrix::applyColScale(&local_ar_matrix,&(this->model_).lp_.scale_);
      HighsSparseMatrix::considerRowScaling
                (&local_ar_matrix,
                 (this->options_).super_HighsOptionsStruct.allowed_matrix_scale_factor,
                 (this->model_).lp_.scale_.row.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start + (this->model_).lp_.num_row_);
    }
    if ((this->basis_).useful == true) {
      appendBasicRowsToBasisInterface(this,ext_num_new_row);
    }
    std::__cxx11::string::string((string *)&local_1a0,"",(allocator *)&local_2c8);
    HighsLp::addRowNames(local_2d8,&local_1a0,ext_num_new_row);
    std::__cxx11::string::~string((string *)&local_1a0);
    pHVar1 = &(this->model_).lp_.num_row_;
    *pHVar1 = *pHVar1 + ext_num_new_row;
    invalidateModelStatusSolutionAndInfo(this);
    HEkk::addRows(&this->ekk_instance_,local_2d8,&local_ar_matrix);
    HVar5 = from_return_status;
  }
  else {
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)&local_2c8,local_2a0,local_2a0 + local_2a8,
               &local_2da);
    std::vector<int,_std::allocator<int>_>::_M_move_assign(&local_ar_matrix.start_,&local_2c8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_2c8);
    std::vector<int,_std::allocator<int>_>::resize
              (&local_ar_matrix.start_,(ulong)(ext_num_new_row + 1));
    local_ar_matrix.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[local_2a8] = ext_num_new_nz;
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)&local_2c8,ext_ar_index,
               ext_ar_index + (uint)ext_num_new_nz,&local_2da);
    std::vector<int,_std::allocator<int>_>::_M_move_assign(&local_ar_matrix.index_,&local_2c8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_2c8);
    std::vector<double,std::allocator<double>>::vector<double_const*,void>
              ((vector<double,std::allocator<double>> *)&local_2c8,ext_ar_value,
               ext_ar_value + (uint)ext_num_new_nz,(allocator_type *)&local_2da);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&local_ar_matrix.value_,&local_2c8)
    ;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_2c8);
    HighsLogOptions::HighsLogOptions(&local_160,local_2d0);
    std::__cxx11::string::string((string *)&local_180,"LP",(allocator *)&local_2da);
    HVar5 = HighsSparseMatrix::assess
                      (&local_ar_matrix,local_2d0,&local_180,
                       (this->options_).super_HighsOptionsStruct.small_matrix_value,
                       (this->options_).super_HighsOptionsStruct.large_matrix_value);
    std::__cxx11::string::string((string *)&local_2c8,"assessMatrix",&local_2d9);
    from_return_status = interpretCallStatus(&local_160,HVar5,from_return_status,&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_180);
    std::_Function_base::~_Function_base(&local_160.user_callback.super__Function_base);
    if (from_return_status != kError) goto LAB_002506a6;
    HVar5 = kError;
  }
  HighsSparseMatrix::~HighsSparseMatrix(&local_ar_matrix);
LAB_00250807:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_rowUpper.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_rowLower.super__Vector_base<double,_std::allocator<double>_>);
  HighsIndexCollection::~HighsIndexCollection(&local_1f0);
  return HVar5;
}

Assistant:

HighsStatus Highs::addRowsInterface(HighsInt ext_num_new_row,
                                    const double* ext_row_lower,
                                    const double* ext_row_upper,
                                    HighsInt ext_num_new_nz,
                                    const HighsInt* ext_ar_start,
                                    const HighsInt* ext_ar_index,
                                    const double* ext_ar_value) {
  // addRows is fundamentally different from addCols, since the new
  // matrix data are held row-wise, so we have to insert data into the
  // column-wise matrix of the LP.
  if (kExtendInvertWhenAddingRows) {
    if (ekk_instance_.status_.has_nla)
      ekk_instance_.debugNlaCheckInvert("Start of Highs::addRowsInterface",
                                        kHighsDebugLevelExpensive + 1);
  }
  HighsStatus return_status = HighsStatus::kOk;
  HighsOptions& options = options_;
  if (ext_num_new_row < 0) return HighsStatus::kError;
  if (ext_num_new_nz < 0) return HighsStatus::kError;
  if (ext_num_new_row == 0) return HighsStatus::kOk;
  if (ext_num_new_row > 0)
    if (isRowDataNull(options.log_options, ext_row_lower, ext_row_upper))
      return HighsStatus::kError;
  if (ext_num_new_nz > 0)
    if (isMatrixDataNull(options.log_options, ext_ar_start, ext_ar_index,
                         ext_ar_value))
      return HighsStatus::kError;

  HighsLp& lp = model_.lp_;
  HighsBasis& basis = basis_;
  HighsScale& scale = lp.scale_;
  bool& useful_basis = basis.useful;

  bool& lp_has_scaling = lp.scale_.has_scaling;

  // Check that if nonzeros are to be added then the model has a positive number
  // of columns
  if (lp.num_col_ <= 0 && ext_num_new_nz > 0) return HighsStatus::kError;

  // Record the new number of rows
  HighsInt newNumRow = lp.num_row_ + ext_num_new_row;

  HighsIndexCollection index_collection;
  index_collection.dimension_ = ext_num_new_row;
  index_collection.is_interval_ = true;
  index_collection.from_ = 0;
  index_collection.to_ = ext_num_new_row - 1;
  // Take a copy of the bounds that can be normalised
  std::vector<double> local_rowLower{ext_row_lower,
                                     ext_row_lower + ext_num_new_row};
  std::vector<double> local_rowUpper{ext_row_upper,
                                     ext_row_upper + ext_num_new_row};

  return_status = interpretCallStatus(
      options_.log_options,
      assessBounds(options, "Row", lp.num_row_, index_collection,
                   local_rowLower, local_rowUpper, options.infinite_bound),
      return_status, "assessBounds");
  if (return_status == HighsStatus::kError) return return_status;
  if (lp.user_bound_scale_) {
    // Assess and apply any user bound scaling
    if (!boundScaleOk(local_rowLower, local_rowUpper, lp.user_bound_scale_,
                      options_.infinite_bound)) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "User bound scaling yields infinite bound\n");
      return HighsStatus::kError;
    }
    double bound_scale_value = std::pow(2, lp.user_bound_scale_);
    for (HighsInt iRow = 0; iRow < ext_num_new_row; iRow++) {
      local_rowLower[iRow] *= bound_scale_value;
      local_rowUpper[iRow] *= bound_scale_value;
    }
  }

  // Append the rows to the LP vectors
  appendRowsToLpVectors(lp, ext_num_new_row, local_rowLower, local_rowUpper);

  // Form a row-wise HighsSparseMatrix of the new matrix rows so that
  // is easy to handle and, if there are nonzeros, it can be
  // normalised
  HighsSparseMatrix local_ar_matrix;
  local_ar_matrix.num_col_ = lp.num_col_;
  local_ar_matrix.num_row_ = ext_num_new_row;
  local_ar_matrix.format_ = MatrixFormat::kRowwise;
  if (ext_num_new_nz) {
    local_ar_matrix.start_ = {ext_ar_start, ext_ar_start + ext_num_new_row};
    local_ar_matrix.start_.resize(ext_num_new_row + 1);
    local_ar_matrix.start_[ext_num_new_row] = ext_num_new_nz;
    local_ar_matrix.index_ = {ext_ar_index, ext_ar_index + ext_num_new_nz};
    local_ar_matrix.value_ = {ext_ar_value, ext_ar_value + ext_num_new_nz};
    // Assess the matrix columns
    return_status =
        interpretCallStatus(options_.log_options,
                            local_ar_matrix.assess(options.log_options, "LP",
                                                   options.small_matrix_value,
                                                   options.large_matrix_value),
                            return_status, "assessMatrix");
    if (return_status == HighsStatus::kError) return return_status;
  } else {
    // No nonzeros so, whether the constraint matrix is row-wise or
    // column-wise, adding the empty matrix is trivial. Complete the
    // setup of an empty row-wise HighsSparseMatrix of the new matrix
    // rows
    local_ar_matrix.start_.assign(ext_num_new_row + 1, 0);
  }
  // Append the rows to LP matrix
  lp.a_matrix_.addRows(local_ar_matrix);
  if (lp_has_scaling) {
    // Extend the row scaling factors
    scale.row.resize(newNumRow);
    for (HighsInt iRow = 0; iRow < ext_num_new_row; iRow++)
      scale.row[lp.num_row_ + iRow] = 1.0;
    scale.num_row = newNumRow;
    // Apply the existing column scaling to the new rows
    local_ar_matrix.applyColScale(scale);
    // Consider applying row scaling to the new rows.
    local_ar_matrix.considerRowScaling(options.allowed_matrix_scale_factor,
                                       &scale.row[lp.num_row_]);
  }
  // Update the basis corresponding to new basic rows
  if (useful_basis) appendBasicRowsToBasisInterface(ext_num_new_row);

  // Possibly add row names
  lp.addRowNames("", ext_num_new_row);

  // Increase the number of rows in the LP
  lp.num_row_ += ext_num_new_row;
  assert(lpDimensionsOk("addRows", lp, options.log_options));

  // Deduce the consequences of adding new rows
  invalidateModelStatusSolutionAndInfo();
  // Determine any implications for simplex data
  ekk_instance_.addRows(lp, local_ar_matrix);

  return return_status;
}